

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chan.h
# Opt level: O2

optional<std::function<void_()>_> * __thiscall
dap::Chan<std::function<void_()>_>::take
          (optional<std::function<void_()>_> *__return_storage_ptr__,
          Chan<std::function<void_()>_> *this)

{
  _Elt_pointer pfVar1;
  _Manager_type p_Var2;
  size_type sVar3;
  type out;
  unique_lock<std::mutex> lock;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  unique_lock<std::mutex> local_28;
  
  std::unique_lock<std::mutex>::unique_lock(&local_28,&this->mutex);
  std::condition_variable::wait<dap::Chan<std::function<void()>>::take()::_lambda()_1_>
            (&this->cv,&local_28,(anon_class_8_1_8991fb9c)this);
  sVar3 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                    (&(this->queue).c);
  if (sVar3 == 0) {
    (__return_storage_ptr__->val).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->val)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->val).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->val).super__Function_base._M_functor + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
  }
  else {
    pfVar1 = (this->queue).c.
             super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_38 = (_Manager_type)0x0;
    local_30 = pfVar1->_M_invoker;
    p_Var2 = (pfVar1->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      local_48._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(pfVar1->super__Function_base)._M_functor;
      local_48._8_8_ = *(undefined8 *)((long)&(pfVar1->super__Function_base)._M_functor + 8);
      (pfVar1->super__Function_base)._M_manager = (_Manager_type)0x0;
      pfVar1->_M_invoker = (_Invoker_type)0x0;
      local_38 = p_Var2;
    }
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              (&(this->queue).c);
    optional<std::function<void()>>::optional<std::function<void()>,void>
              ((optional<std::function<void()>> *)__return_storage_ptr__,
               (function<void_()> *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return __return_storage_ptr__;
}

Assistant:

optional<T> Chan<T>::take() {
  std::unique_lock<std::mutex> lock(mutex);
  cv.wait(lock, [&] { return queue.size() > 0 || closed; });
  if (queue.size() == 0) {
    return optional<T>();
  }
  auto out = std::move(queue.front());
  queue.pop();
  return optional<T>(std::move(out));
}